

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::PrintHeapBlockStats(Recycler *this,char16 *name,HeapBlockType type)

{
  ulong uVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  
  uVar3 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  uVar1 = (this->collectionStats).heapBlockCount[uVar3];
  uVar2 = (this->collectionStats).heapBlockFreeCount[uVar3];
  auVar5._8_8_ = uVar1;
  auVar5._0_8_ = uVar2;
  auVar5 = pblendw(auVar5,(undefined1  [16])0x0,0xcc);
  lVar4 = uVar1 - uVar2;
  Output::Print(L" %6s : %5d %5d %5d %5.1f",
                ((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 SUB168(auVar5 | _DAT_0030b490,0)) /
                (((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                SUB168(auVar5 | _DAT_0030b490,8))) * 100.0,name,lVar4);
  if (type < LargeBlockType) {
    auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar8._0_8_ = lVar4;
    auVar8._12_4_ = 0x45300000;
    uVar1 = (this->collectionStats).heapBlockConcurrentSweptCount[uVar3];
    uVar2 = (this->collectionStats).heapBlockSweptCount[uVar3];
    auVar6._8_8_ = uVar2;
    auVar6._0_8_ = uVar1;
    auVar5 = pblendw((undefined1  [16])0x0,auVar6,0x33);
    dVar7 = ((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
            SUB168(auVar5 | _DAT_0030b490,8);
    Output::Print(L" : %5d %6.1f : %5d %6.1f",
                  (dVar7 / (((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) +
                           (auVar8._8_8_ - 1.9342813113834067e+25))) * 100.0,
                  ((((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                   SUB168(auVar5 | _DAT_0030b490,0)) / dVar7) * 100.0);
    return;
  }
  return;
}

Assistant:

void
Recycler::PrintHeapBlockStats(char16 const * name, HeapBlock::HeapBlockType type)
{
    size_t liveCount = collectionStats.heapBlockCount[type] - collectionStats.heapBlockFreeCount[type];

    Output::Print(_u(" %6s : %5d %5d %5d %5.1f"), name,
        liveCount, collectionStats.heapBlockFreeCount[type], collectionStats.heapBlockCount[type],
        (double)collectionStats.heapBlockFreeCount[type] / (double)collectionStats.heapBlockCount[type] * 100);

    if (type < HeapBlock::SmallBlockTypeCount)
    {
        Output::Print(_u(" : %5d %6.1f : %5d %6.1f"),
            collectionStats.heapBlockSweptCount[type],
            (double)collectionStats.heapBlockSweptCount[type] / (double)liveCount * 100,
            collectionStats.heapBlockConcurrentSweptCount[type],
            (double)collectionStats.heapBlockConcurrentSweptCount[type] / (double)collectionStats.heapBlockSweptCount[type] * 100);
    }
}